

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O0

string * __thiscall pbrt::MLTSampler::DumpState_abi_cxx11_(MLTSampler *this)

{
  const_iterator pPVar1;
  long in_RSI;
  string *in_RDI;
  PrimarySample *Xi;
  const_iterator __end1;
  const_iterator __begin1;
  vector<pbrt::MLTSampler::PrimarySample,_pstd::pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>_>
  *__range1;
  string *state;
  const_iterator args;
  char *in_stack_ffffffffffffff98;
  const_iterator local_28;
  
  std::__cxx11::string::string((string *)in_RDI);
  local_28 = pstd::
             vector<pbrt::MLTSampler::PrimarySample,_pstd::pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>_>
             ::begin((vector<pbrt::MLTSampler::PrimarySample,_pstd::pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>_>
                      *)(in_RSI + 0x28));
  args = local_28;
  pPVar1 = pstd::
           vector<pbrt::MLTSampler::PrimarySample,_pstd::pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>_>
           ::end((vector<pbrt::MLTSampler::PrimarySample,_pstd::pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>_>
                  *)(in_RSI + 0x28));
  for (; local_28 != pPVar1; local_28 = local_28 + 1) {
    StringPrintf<float_const&>(in_stack_ffffffffffffff98,&args->value);
    std::__cxx11::string::operator+=((string *)in_RDI,(string *)&stack0xffffffffffffff98);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  }
  std::__cxx11::string::operator+=((string *)in_RDI,"0");
  return in_RDI;
}

Assistant:

std::string MLTSampler::DumpState() const {
    std::string state;
    for (const PrimarySample &Xi : X)
        state += StringPrintf("%f,", Xi.value);
    state += "0";
    return state;
}